

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcEdge::IfcEdge(IfcEdge *this)

{
  *(undefined ***)&this->field_0x40 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x48 = 0;
  *(char **)&this->field_0x50 = "IfcEdge";
  IfcTopologicalRepresentationItem::IfcTopologicalRepresentationItem
            (&this->super_IfcTopologicalRepresentationItem,&PTR_construction_vtable_24__0082bcc8);
  *(undefined8 *)&(this->super_IfcTopologicalRepresentationItem).field_0x28 = 0;
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x82bc38;
  *(undefined8 *)&this->field_0x40 = 0x82bcb0;
  *(undefined8 *)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x82bc60;
  *(undefined8 *)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x82bc88;
  *(undefined8 *)&(this->super_IfcTopologicalRepresentationItem).field_0x30 = 0;
  (this->EdgeEnd).obj = (LazyObject *)0x0;
  return;
}

Assistant:

IfcEdge() : Object("IfcEdge") {}